

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int64_suite::test_array64_int64_empty(void)

{
  bool bVar1;
  view_type *this;
  undefined4 local_70;
  value local_6c [2];
  undefined4 local_64;
  value local_60 [2];
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [9];
  
  decoder.current.view._M_str = (uchar *)0xde;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            ((decoder *)local_40,(uchar (*) [9])&decoder.current.view._M_str);
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 0xde;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbf3,"void compact_int64_suite::test_array64_int64_empty()",local_48,&local_4c);
  local_54[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_40);
  local_58 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbf4,"void compact_int64_suite::test_array64_int64_empty()",local_54,&local_58);
  local_60[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_40);
  local_64 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbf5,"void compact_int64_suite::test_array64_int64_empty()",local_60,&local_64);
  this = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_40);
  bVar1 = std::
          basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
          ::empty(this);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbf6,"void compact_int64_suite::test_array64_int64_empty()",(bool)(-bVar1 & 1));
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_40);
  local_6c[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_70 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbf8,"void compact_int64_suite::test_array64_int64_empty()",local_6c,&local_70);
  return;
}

Assistant:

void test_array64_int64_empty()
{
    const value_type input[] = { token::code::array64_int64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_int64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}